

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::changeColsBounds(Highs *this,HighsInt *mask,double *lower,double *upper)

{
  HighsStatus HVar1;
  HighsStatus HVar2;
  HighsStatus return_status;
  HighsStatus call_status;
  double *in_stack_000000d0;
  double *in_stack_000000d8;
  bool create_error;
  HighsIndexCollection index_collection;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 uVar3;
  allocator local_119;
  string local_118 [4];
  HighsInt in_stack_fffffffffffffeec;
  string *in_stack_fffffffffffffef0;
  HighsStatus in_stack_fffffffffffffef8;
  HighsStatus in_stack_fffffffffffffefc;
  Highs *in_stack_ffffffffffffff00;
  HighsStatus local_4;
  
  clearDerivedModelProperties
            ((Highs *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  HighsIndexCollection::HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  create((HighsIndexCollection *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
         (HighsInt *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  HVar1 = changeColBoundsInterface
                    ((Highs *)index_collection._8_8_,(HighsIndexCollection *)index_collection._0_8_,
                     in_stack_000000d8,in_stack_000000d0);
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  uVar3 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"changeColBounds",&local_119);
  HVar2 = interpretCallStatus((HighsLogOptions *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc
                              ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x494bf5);
  if (HVar2 == kError) {
    local_4 = kError;
  }
  else {
    local_4 = returnFromHighs(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)CONCAT44(uVar3,HVar1));
  return local_4;
}

Assistant:

HighsStatus Highs::changeColsBounds(const HighsInt* mask, const double* lower,
                                    const double* upper) {
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const bool create_error = create(index_collection, mask, model_.lp_.num_col_);
  assert(!create_error);
  (void)create_error;
  HighsStatus call_status =
      changeColBoundsInterface(index_collection, lower, upper);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeColBounds");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}